

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_nls.c
# Opt level: O2

int IDASetNlsResFn(void *ida_mem,IDAResFn res)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x8f,"IDASetNlsResFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_nls.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    if (res == (IDAResFn)0x0) {
      *(undefined8 *)((long)ida_mem + 1000) = *(undefined8 *)((long)ida_mem + 0x10);
    }
    else {
      *(IDAResFn *)((long)ida_mem + 1000) = res;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDASetNlsResFn(void* ida_mem, IDAResFn res)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (res) { IDA_mem->nls_res = res; }
  else { IDA_mem->nls_res = IDA_mem->ida_res; }

  return (IDA_SUCCESS);
}